

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

uint64_t cpu_mapping_to_gpu_addr(cpu_mapping *mapping,uint64_t offset)

{
  gpu_mapping *pgVar1;
  ulong uVar2;
  gpu_mapping **ppgVar3;
  ulong uVar4;
  
  if (mapping->object != (gpu_object *)0x0) {
    uVar4 = offset + mapping->object_offset;
    ppgVar3 = &mapping->object->gpu_mappings;
    while (pgVar1 = *ppgVar3, pgVar1 != (gpu_mapping *)0x0) {
      uVar2 = pgVar1->object_offset;
      if ((uVar2 <= uVar4) && (uVar4 < uVar2 + pgVar1->length)) {
        return (uVar4 - uVar2) + pgVar1->address;
      }
      ppgVar3 = &pgVar1->next;
    }
  }
  return 0;
}

Assistant:

uint64_t cpu_mapping_to_gpu_addr(struct cpu_mapping *mapping, uint64_t offset)
{
	uint64_t gpu_addr = 0;
	struct gpu_object *obj = mapping->object;
	uint64_t off = mapping->object_offset + offset;

	if (!obj)
		return 0;

	struct gpu_mapping *gpu_mapping;
	for (gpu_mapping = obj->gpu_mappings; gpu_mapping != NULL; gpu_mapping = gpu_mapping->next)
		if (off >= gpu_mapping->object_offset &&
			off <  gpu_mapping->object_offset + gpu_mapping->length)
			break;

	if (gpu_mapping)
		gpu_addr = gpu_mapping->address + (off - gpu_mapping->object_offset);

	return gpu_addr;
}